

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O0

void TPZShapeH1<pzshape::TPZShapeQuad>::Shape(TPZVec<double> *pt,TPZShapeData *data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int64_t iVar4;
  double *pdVar5;
  TPZFMatrix<double> *pTVar6;
  long in_RSI;
  double dVar7;
  int xj_1;
  int i_1;
  int xj;
  int i;
  TPZFMatrix<double> *mult;
  TPZFNMatrix<1,_double> auxmat;
  int opt;
  REAL beta;
  REAL alpha;
  TPZManVector<double,_3> outvec;
  TPZFNMatrix<100,_double> dphiaux2;
  TPZFNMatrix<100,_double> dphiaux;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<100,_double> phin;
  int sidedim;
  TPZTransform<double> *transform;
  int d_1;
  int numshape;
  int side;
  int shape;
  int d;
  int nod;
  TPZFNMatrix<18,_double> dphiblend;
  TPZFNMatrix<18,_double> phiblend;
  int NCorners;
  int NSides;
  int dim;
  _func_int **in_stack_ffffffffffffebe8;
  TPZFMatrix<double> *in_stack_ffffffffffffebf0;
  TPZFMatrix<double> *in_stack_ffffffffffffebf8;
  double *in_stack_ffffffffffffec00;
  TPZVec<double> *in_stack_ffffffffffffec08;
  TPZFNMatrix<100,_double> *in_stack_ffffffffffffec10;
  TPZVec<double> *in_stack_ffffffffffffec18;
  TPZTransform<double> *in_stack_ffffffffffffec20;
  double *in_stack_ffffffffffffec28;
  TPZFNMatrix<1,_double> *in_stack_ffffffffffffec30;
  TPZFMatrix<double> *in_stack_ffffffffffffec80;
  TPZFMatrix<double> *in_stack_ffffffffffffec88;
  TPZVec<double> *in_stack_ffffffffffffec90;
  TPZFMatrix<double> *in_stack_ffffffffffffeca0;
  TPZFMatrix<double> *in_stack_ffffffffffffeca8;
  TPZVec<double> *in_stack_ffffffffffffecb0;
  int local_1298;
  int local_1294;
  int local_1290;
  int local_128c;
  undefined1 local_1278 [164];
  undefined4 local_11d4;
  undefined8 local_11d0;
  undefined8 local_11c8;
  undefined1 local_dd0 [952];
  undefined1 local_a18 [1908];
  int local_2a4;
  TPZTransform<double> *local_2a0;
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  
  local_10 = in_RSI;
  pzshape::TPZShapeQuad::ShapeCorner
            (in_stack_ffffffffffffec90,in_stack_ffffffffffffec88,in_stack_ffffffffffffec80);
  iVar4 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(local_10 + 0x22a0));
  if (iVar4 != 4) {
    local_14 = 2;
    local_18 = 9;
    local_1c = 4;
    TPZFNMatrix<18,_double>::TPZFNMatrix
              ((TPZFNMatrix<18,_double> *)in_stack_ffffffffffffec10,
               (int64_t)in_stack_ffffffffffffec08,(int64_t)in_stack_ffffffffffffec00);
    TPZFNMatrix<18,_double>::TPZFNMatrix
              ((TPZFNMatrix<18,_double> *)in_stack_ffffffffffffec10,
               (int64_t)in_stack_ffffffffffffec08,(int64_t)in_stack_ffffffffffffec00);
    for (local_280 = 0; local_280 < 4; local_280 = local_280 + 1) {
      pdVar5 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffec08,(int64_t)in_stack_ffffffffffffec00);
      dVar7 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffec08,(int64_t)in_stack_ffffffffffffec00);
      *pdVar5 = dVar7;
      for (local_284 = 0; local_284 < 2; local_284 = local_284 + 1) {
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffec08,(int64_t)in_stack_ffffffffffffec00);
        dVar7 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffec08,(int64_t)in_stack_ffffffffffffec00);
        *pdVar5 = dVar7;
      }
    }
    pzshape::TPZShapeQuad::ShapeGenerating
              (in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
    local_288 = 4;
    for (local_28c = 4; local_28c < 9; local_28c = local_28c + 1) {
      TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x70),(long)(local_28c + -4));
      local_290 = pzshape::TPZShapeQuad::NConnectShapeF
                            ((int)in_stack_ffffffffffffebf0,
                             (int)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
      if (local_290 != 0) {
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffec08,(int64_t)in_stack_ffffffffffffec00);
        dVar7 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffec08,(int64_t)in_stack_ffffffffffffec00);
        *pdVar5 = dVar7;
        for (local_294 = 0; local_294 < 2; local_294 = local_294 + 1) {
          pdVar5 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffec08,(int64_t)in_stack_ffffffffffffec00)
          ;
          dVar7 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffec08,(int64_t)in_stack_ffffffffffffec00)
          ;
          *pdVar5 = dVar7;
        }
        local_288 = local_288 + 1;
        if (local_290 != 1) {
          local_2a0 = TPZVec<TPZTransform<double>_>::operator[]
                                ((TPZVec<TPZTransform<double>_> *)(local_10 + 400),
                                 (long)(local_28c + -4));
          local_2a4 = pztopology::TPZQuadrilateral::SideDimension(0x189f72f);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffec10,(int64_t)in_stack_ffffffffffffec08,
                     (int64_t)in_stack_ffffffffffffec00);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffec10,(int64_t)in_stack_ffffffffffffec08,
                     (int64_t)in_stack_ffffffffffffec00);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffec10,(int64_t)in_stack_ffffffffffffec08,
                     (int64_t)in_stack_ffffffffffffec00);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffec10,(int64_t)in_stack_ffffffffffffec08,
                     (int64_t)in_stack_ffffffffffffec00);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffec10,
                     (int64_t)in_stack_ffffffffffffec08);
          TPZTransform<double>::Apply
                    (in_stack_ffffffffffffec20,in_stack_ffffffffffffec18,
                     (TPZVec<double> *)in_stack_ffffffffffffec10);
          TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x70),(long)(local_28c + -4));
          pzshape::TPZShapeQuad::ShapeInternal
                    ((int)((ulong)in_stack_ffffffffffffec10 >> 0x20),in_stack_ffffffffffffec08,
                     (int)((ulong)in_stack_ffffffffffffec00 >> 0x20),in_stack_ffffffffffffebf8,
                     in_stack_ffffffffffffebf0);
          if (local_2a4 < 3) {
            local_11c8 = 0x3ff0000000000000;
            local_11d0 = 0;
            local_11d4 = 1;
            TPZFNMatrix<1,_double>::TPZFNMatrix
                      (in_stack_ffffffffffffec30,(int64_t)in_stack_ffffffffffffec28,
                       (int64_t)in_stack_ffffffffffffec20,(double *)in_stack_ffffffffffffec18);
            pTVar6 = TPZTransform<double>::Mult(local_2a0);
            (*(pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x27])(0x3ff0000000000000,0,pTVar6,local_a18,local_1278,local_dd0,1);
            for (local_128c = 1; local_128c < local_290; local_128c = local_128c + 1) {
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffec08,
                                  (int64_t)in_stack_ffffffffffffec00);
              dVar7 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffec08,
                                  (int64_t)in_stack_ffffffffffffec00);
              dVar7 = dVar7 * *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffec08,
                                  (int64_t)in_stack_ffffffffffffec00);
              *pdVar5 = dVar7;
              for (local_1290 = 0; local_1290 < 2; local_1290 = local_1290 + 1) {
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffec08,
                                    (int64_t)in_stack_ffffffffffffec00);
                dVar7 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffec08,
                                    (int64_t)in_stack_ffffffffffffec00);
                dVar1 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffec08,
                                    (int64_t)in_stack_ffffffffffffec00);
                dVar2 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffec08,
                                    (int64_t)in_stack_ffffffffffffec00);
                dVar3 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffec08,
                                    (int64_t)in_stack_ffffffffffffec00);
                *pdVar5 = dVar7 * dVar1 + dVar2 * dVar3;
              }
              local_288 = local_288 + 1;
            }
            TPZFNMatrix<1,_double>::~TPZFNMatrix((TPZFNMatrix<1,_double> *)0x189fc41);
          }
          else {
            for (local_1294 = 1; local_1294 < local_290; local_1294 = local_1294 + 1) {
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffec08,
                                  (int64_t)in_stack_ffffffffffffec00);
              dVar7 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffec08,
                                  (int64_t)in_stack_ffffffffffffec00);
              in_stack_ffffffffffffec30 = (TPZFNMatrix<1,_double> *)(dVar7 * *pdVar5);
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffec08,
                                  (int64_t)in_stack_ffffffffffffec00);
              *pdVar5 = (double)in_stack_ffffffffffffec30;
              for (local_1298 = 0; local_1298 < 2; local_1298 = local_1298 + 1) {
                in_stack_ffffffffffffec28 =
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffec08,
                                (int64_t)in_stack_ffffffffffffec00);
                in_stack_ffffffffffffec18 = (TPZVec<double> *)*in_stack_ffffffffffffec28;
                in_stack_ffffffffffffec20 =
                     (TPZTransform<double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffec08,
                                (int64_t)in_stack_ffffffffffffec00);
                in_stack_ffffffffffffec08 =
                     (TPZVec<double> *)
                     (in_stack_ffffffffffffec20->super_TPZSavable)._vptr_TPZSavable;
                in_stack_ffffffffffffec10 =
                     (TPZFNMatrix<100,_double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffec08,
                                (int64_t)in_stack_ffffffffffffec00);
                in_stack_ffffffffffffebf8 =
                     (TPZFMatrix<double> *)
                     (in_stack_ffffffffffffec10->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                     super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
                in_stack_ffffffffffffec00 =
                     TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_ffffffffffffec10,
                                (int64_t)in_stack_ffffffffffffec08,
                                (int64_t)in_stack_ffffffffffffec00);
                in_stack_ffffffffffffebe8 =
                     (_func_int **)
                     ((double)in_stack_ffffffffffffec18 * (double)in_stack_ffffffffffffec08 +
                     (double)in_stack_ffffffffffffebf8 * *in_stack_ffffffffffffec00);
                in_stack_ffffffffffffebf0 =
                     (TPZFMatrix<double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffec10->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffec08,
                                (int64_t)in_stack_ffffffffffffec00);
                (in_stack_ffffffffffffebf0->super_TPZMatrix<double>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable = in_stack_ffffffffffffebe8;
              }
              local_288 = local_288 + 1;
            }
          }
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffebf0);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x189fe93);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x189fea0);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x189fead);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x189feba);
        }
      }
    }
    TPZFNMatrix<18,_double>::~TPZFNMatrix((TPZFNMatrix<18,_double> *)0x189ff20);
    TPZFNMatrix<18,_double>::~TPZFNMatrix((TPZFNMatrix<18,_double> *)0x189ff2d);
  }
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data) {

    
//    TPZVec<REAL> &pt = par.pt;
//    TPZFMatrix<REAL> &phi = par.phi;
//    TPZFMatrix<REAL> &dphi = par.dphi;
    
    TSHAPE::ShapeCorner(pt,data.fPhi,data.fDPhi);
    
    if(data.fPhi.Rows() == TSHAPE::NCornerNodes) return;
    
    const int dim = TSHAPE::Dimension;
    const int NSides = TSHAPE::NSides;
    const int NCorners = TSHAPE::NCornerNodes;

    TPZFNMatrix<NSides*dim,REAL> phiblend(NSides,1),dphiblend(dim,NSides);
    for(int nod=0; nod<NCorners; nod++)
    {
        phiblend(nod,0) = data.fPhi(nod,0);
        for(int d=0; d< dim; d++)
        {
            dphiblend(d,nod) = data.fDPhi(d,nod);
        }
    }
    TSHAPE::ShapeGenerating(pt, phiblend, dphiblend);
    int shape = NCorners;
    for (int side = NCorners; side<NSides ; side++)
    {
        int numshape = TSHAPE::NConnectShapeF(side, data.fH1ConnectOrders[side-NCorners]);
        if(numshape == 0) continue;
        
        data.fPhi(shape,0) = phiblend(side,0);
        for(int d=0; d<dim; d++) data.fDPhi(d,shape) = dphiblend(d,side);
        shape++;
        
        if(numshape == 1) continue;
        
        TPZTransform<REAL> &transform = data.fSideTransforms[side - NCorners];
        int sidedim = TSHAPE::SideDimension(side);
        TPZFNMatrix<100,REAL> phin(numshape,1), dphin(sidedim,numshape), dphiaux(TSHAPE::Dimension,numshape),
            dphiaux2(TSHAPE::Dimension,numshape);
        TPZManVector<REAL,3> outvec(sidedim);
        transform.Apply(pt, outvec);
//        dphin.Zero();
        TSHAPE::ShapeInternal(side, outvec,data.fH1ConnectOrders[side - NCorners], phin, dphin);
        if(sidedim < 3)
        {
            constexpr REAL alpha = 1.;
            constexpr REAL beta = 0.;
            constexpr int opt = 1;
            TPZFNMatrix<1,REAL> auxmat(1,1,0);    
            TPZFMatrix<REAL> &mult = transform.Mult();
            mult.MultAdd(dphin, auxmat, dphiaux,alpha,beta,opt);
            
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphiaux(xj,i);
                }
                shape++;
            }
        } else
        {
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphin(xj,i);
                }
                shape++;
            }

        }
    }
    
}